

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_listener_set_tls(nng_listener id,nng_tls_config *cfg)

{
  int iVar1;
  nni_listener *local_20;
  nni_listener *l;
  
  iVar1 = nni_listener_find(&local_20,id.id);
  if (iVar1 == 0) {
    iVar1 = nni_listener_set_tls(local_20,cfg);
    nni_listener_rele(local_20);
  }
  return iVar1;
}

Assistant:

int
nng_listener_set_tls(nng_listener id, nng_tls_config *cfg)
{
	int           rv;
	nni_listener *l;
	if ((rv = nni_listener_find(&l, id.id)) != 0) {
		return (rv);
	}
	rv = nni_listener_set_tls(l, cfg);
	nni_listener_rele(l);
	return (rv);
}